

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

Image * __thiscall
anon_unknown.dwarf_353bb::ImageManager::operator()(ImageManager *this,Image *image)

{
  code cVar1;
  pointer this_00;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this_01;
  uint __flags;
  ImageTemplate<unsigned_char> *in_RSI;
  __fn *in_RDI;
  void *in_R8;
  value_type *in_stack_ffffffffffffff78;
  vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  *in_stack_ffffffffffffff80;
  pointer local_20;
  ImageTemplate<unsigned_char> *local_18;
  reference local_8;
  
  local_18 = in_RSI;
  cVar1 = (code)PenguinV_Image::ImageTemplate<unsigned_char>::type(in_RSI);
  __flags = (uint)(byte)in_RDI[0x68];
  if (cVar1 == in_RDI[0x68]) {
    local_8 = local_18;
  }
  else {
    this_00 = (pointer)operator_new(8);
    ReferenceOwner::ReferenceOwner((ReferenceOwner *)this_00,local_18);
    local_20 = this_00;
    std::
    vector<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
    ::push_back(in_stack_ffffffffffffff80,(value_type *)in_stack_ffffffffffffff78);
    this_01 = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               *)(in_RDI + 0x50);
    _clone((ImageManager *)&stack0xffffffffffffffa8,in_RDI,local_18,__flags,in_R8);
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::push_back(this_01,in_stack_ffffffffffffff78);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x11ca61);
    local_8 = std::
              vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
              ::back(this_01);
  }
  return local_8;
}

Assistant:

PenguinV_Image::Image & operator ()( PenguinV_Image::Image & image )
        {
            if ( image.type() != _type ) {
                _output.push_back( new ReferenceOwner( image ) );
                _outputClone.push_back( _clone( image ) );
                return _outputClone.back();
            }
            else {
                return image;
            }
        }